

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_copyBlockSequences
                 (SeqCollector *seqCollector,seqStore_t *seqStore,U32 *prevRepcodes)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  seqDef *psVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  size_t sVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  uint *puVar14;
  uint uVar15;
  undefined8 local_70;
  uint local_68;
  BYTE *local_60;
  ZSTD_Sequence *local_58;
  BYTE *local_50;
  ulong local_48;
  size_t local_40;
  SeqCollector *local_38;
  
  psVar4 = seqStore->sequencesStart;
  lVar12 = (long)seqStore->sequences - (long)psVar4 >> 3;
  local_40 = seqCollector->seqIndex;
  local_48 = lVar12 + 1;
  sVar8 = 0xffffffffffffffba;
  if (local_48 <= seqCollector->maxSequences - local_40) {
    local_50 = seqStore->lit;
    local_60 = seqStore->litStart;
    local_38 = seqCollector;
    local_58 = seqCollector->seqStart + local_40;
    local_68 = prevRepcodes[2];
    local_70 = *(undefined8 *)prevRepcodes;
    if (seqStore->sequences == psVar4) {
      iVar7 = 0;
    }
    else {
      local_70._4_4_ = (uint)((ulong)local_70 >> 0x20);
      uVar3 = seqStore->longLengthPos;
      puVar14 = &seqCollector->seqStart[local_40].rep;
      iVar7 = 0;
      uVar13 = 0;
      uVar15 = (uint)local_70;
      do {
        uVar1 = psVar4[uVar13].litLength;
        uVar11 = (uint)uVar1;
        puVar14[-2] = (uint)uVar1;
        uVar2 = psVar4[uVar13].mlBase;
        puVar14[-1] = uVar2 + 3;
        *puVar14 = 0;
        uVar10 = (uint)uVar1;
        if (uVar3 == uVar13) {
          uVar10 = uVar11;
          if (seqStore->longLengthType == ZSTD_llt_matchLength) {
            puVar14[-1] = uVar2 + 0x10003;
          }
          else if (seqStore->longLengthType == ZSTD_llt_literalLength) {
            puVar14[-2] = uVar11 + 0x10000;
            uVar10 = uVar11 + 0x10000;
          }
        }
        uVar6 = psVar4[uVar13].offBase;
        uVar9 = local_70._4_4_;
        if (uVar6 - 1 < 3) {
          *puVar14 = uVar6;
          if (uVar10 == 0) {
            if (uVar6 == 3) {
              uVar5 = uVar15 - 1;
            }
            else {
              uVar5 = *(uint *)((long)&local_70 + (ulong)uVar6 * 4);
            }
          }
          else {
            uVar5 = *(uint *)((long)&local_70 + (ulong)(uVar6 - 1) * 4);
          }
          ((ZSTD_Sequence *)(puVar14 + -3))->offset = uVar5;
LAB_003575c6:
          uVar6 = uVar6 - (uVar11 != 0);
          uVar5 = uVar15;
          if (uVar6 != 0) {
            if (uVar6 == 3) {
              uVar5 = uVar15 - 1;
            }
            else {
              uVar5 = *(uint *)((long)&local_70 + (ulong)uVar6 * 4);
            }
            if (uVar6 == 1) {
              uVar9 = local_68;
            }
            goto LAB_003575e9;
          }
        }
        else {
          uVar5 = uVar6 - 3;
          ((ZSTD_Sequence *)(puVar14 + -3))->offset = uVar5;
          if (uVar6 < 4) goto LAB_003575c6;
LAB_003575e9:
          local_68 = uVar9;
          local_70 = CONCAT44(uVar15,uVar5);
          local_70._4_4_ = uVar15;
        }
        uVar15 = uVar5;
        iVar7 = iVar7 + uVar10;
        uVar13 = uVar13 + 1;
        puVar14 = puVar14 + 4;
      } while (lVar12 + (ulong)(lVar12 == 0) != uVar13);
    }
    local_58[lVar12].litLength = (int)local_50 - (iVar7 + (int)local_60);
    sVar8 = 0;
    local_58[lVar12].matchLength = 0;
    local_58[lVar12].offset = 0;
    seqCollector->seqIndex = local_48 + local_40;
  }
  return sVar8;
}

Assistant:

static size_t ZSTD_copyBlockSequences(SeqCollector* seqCollector, const seqStore_t* seqStore, const U32 prevRepcodes[ZSTD_REP_NUM])
{
    const seqDef* inSeqs = seqStore->sequencesStart;
    const size_t nbInSequences = seqStore->sequences - inSeqs;
    const size_t nbInLiterals = (size_t)(seqStore->lit - seqStore->litStart);

    ZSTD_Sequence* outSeqs = seqCollector->seqIndex == 0 ? seqCollector->seqStart : seqCollector->seqStart + seqCollector->seqIndex;
    const size_t nbOutSequences = nbInSequences + 1;
    size_t nbOutLiterals = 0;
    repcodes_t repcodes;
    size_t i;

    /* Bounds check that we have enough space for every input sequence
     * and the block delimiter
     */
    assert(seqCollector->seqIndex <= seqCollector->maxSequences);
    RETURN_ERROR_IF(
        nbOutSequences > (size_t)(seqCollector->maxSequences - seqCollector->seqIndex),
        dstSize_tooSmall,
        "Not enough space to copy sequences");

    ZSTD_memcpy(&repcodes, prevRepcodes, sizeof(repcodes));
    for (i = 0; i < nbInSequences; ++i) {
        U32 rawOffset;
        outSeqs[i].litLength = inSeqs[i].litLength;
        outSeqs[i].matchLength = inSeqs[i].mlBase + MINMATCH;
        outSeqs[i].rep = 0;

        /* Handle the possible single length >= 64K
         * There can only be one because we add MINMATCH to every match length,
         * and blocks are at most 128K.
         */
        if (i == seqStore->longLengthPos) {
            if (seqStore->longLengthType == ZSTD_llt_literalLength) {
                outSeqs[i].litLength += 0x10000;
            } else if (seqStore->longLengthType == ZSTD_llt_matchLength) {
                outSeqs[i].matchLength += 0x10000;
            }
        }

        /* Determine the raw offset given the offBase, which may be a repcode. */
        if (OFFBASE_IS_REPCODE(inSeqs[i].offBase)) {
            const U32 repcode = OFFBASE_TO_REPCODE(inSeqs[i].offBase);
            assert(repcode > 0);
            outSeqs[i].rep = repcode;
            if (outSeqs[i].litLength != 0) {
                rawOffset = repcodes.rep[repcode - 1];
            } else {
                if (repcode == 3) {
                    assert(repcodes.rep[0] > 1);
                    rawOffset = repcodes.rep[0] - 1;
                } else {
                    rawOffset = repcodes.rep[repcode];
                }
            }
        } else {
            rawOffset = OFFBASE_TO_OFFSET(inSeqs[i].offBase);
        }
        outSeqs[i].offset = rawOffset;

        /* Update repcode history for the sequence */
        ZSTD_updateRep(repcodes.rep,
                       inSeqs[i].offBase,
                       inSeqs[i].litLength == 0);

        nbOutLiterals += outSeqs[i].litLength;
    }
    /* Insert last literals (if any exist) in the block as a sequence with ml == off == 0.
     * If there are no last literals, then we'll emit (of: 0, ml: 0, ll: 0), which is a marker
     * for the block boundary, according to the API.
     */
    assert(nbInLiterals >= nbOutLiterals);
    {
        const size_t lastLLSize = nbInLiterals - nbOutLiterals;
        outSeqs[nbInSequences].litLength = (U32)lastLLSize;
        outSeqs[nbInSequences].matchLength = 0;
        outSeqs[nbInSequences].offset = 0;
        assert(nbOutSequences == nbInSequences + 1);
    }
    seqCollector->seqIndex += nbOutSequences;
    assert(seqCollector->seqIndex <= seqCollector->maxSequences);

    return 0;
}